

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::Registry::LookupOne
          (Registry *this,Network *aPred,Network *aRet)

{
  char cVar1;
  int iVar2;
  Status SVar3;
  NetworkArray networks;
  
  networks.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  networks.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  networks.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar2 = (*this->mStorage->_vptr_PersistentStorage[0x16])();
  cVar1 = (char)iVar2;
  SVar3 = kNotFound;
  if (cVar1 != '\x01') {
    SVar3 = (cVar1 != '\0') << 2;
  }
  if (cVar1 == '\0') {
    SVar3 = kAmbiguity;
    if ((long)networks.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)networks.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x60) {
      Network::operator=(aRet,networks.
                              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      SVar3 = kSuccess;
    }
  }
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::~vector(&networks);
  return SVar3;
}

Assistant:

Registry::Status Registry::LookupOne(const Network &aPred, Network &aRet)
{
    Registry::Status status;
    NetworkArray     networks;
    VerifyOrExit((status = MapStatus(mStorage->Lookup(aPred, networks))) == Registry::Status::kSuccess);
    VerifyOrExit(networks.size() == 1, status = Registry::Status::kAmbiguity);
    aRet = networks[0];
exit:
    return status;
}